

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

int __thiscall PP_Expression::conditional_expression(PP_Expression *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = logical_OR_expression(this);
  bVar1 = Parser::test(&this->super_Parser,PP_QUESTION);
  iVar3 = iVar2;
  if (bVar1) {
    iVar3 = conditional_expression(this);
    bVar1 = Parser::test(&this->super_Parser,COLON);
    iVar4 = 0;
    if (bVar1) {
      iVar4 = conditional_expression(this);
    }
    if (iVar2 == 0) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

int PP_Expression::conditional_expression()
{
    int value = logical_OR_expression();
    if (test(PP_QUESTION)) {
        int alt1 = conditional_expression();
        int alt2 = test(PP_COLON) ? conditional_expression() : 0;
        return value ? alt1 : alt2;
    }
    return value;
}